

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O1

void __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::
TextureBorderClampSamplingTexture
          (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *this,Context *context,
          ExtParameters *extParams,char *name,char *description,
          TestConfiguration<unsigned_char,_unsigned_char> *configuration)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampSamplingTexture_0214a4d8;
  this->m_attr_position_location = -1;
  this->m_attr_texcoord_location = -1;
  this->m_fbo_id = 0;
  this->m_fs_id = 0;
  this->m_po_id = 0;
  this->m_sampler_id = 0;
  TestConfiguration<unsigned_char,_unsigned_char>::TestConfiguration
            (&this->m_test_configuration,configuration);
  this->m_input_to_id = 0;
  this->m_output_to_id = 0;
  this->m_position_vbo_id = 0;
  this->m_text_coord_vbo_id = 0;
  this->m_vs_id = 0;
  this->m_vao_id = 0;
  return;
}

Assistant:

TextureBorderClampSamplingTexture<InputType, OutputType>::TextureBorderClampSamplingTexture(
	Context& context, const ExtParameters& extParams, const char* name, const char* description,
	const TestConfiguration<InputType, OutputType>& configuration)
	: TestCaseBase(context, extParams, name, description)
	, m_attr_position_location(-1)
	, m_attr_texcoord_location(-1)
	, m_fbo_id(0)
	, m_fs_id(0)
	, m_po_id(0)
	, m_sampler_id(0)
	, m_test_configuration(configuration)
	, m_input_to_id(0)
	, m_output_to_id(0)
	, m_position_vbo_id(0)
	, m_text_coord_vbo_id(0)
	, m_vs_id(0)
	, m_vao_id(0)
{
	/* Nothing to be done here */
}